

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

uint mraa_get_platform_adc_supported_bits(int platform_offset)

{
  mraa_boolean_t mVar1;
  uint local_c;
  int platform_offset_local;
  
  if (platform_offset == 0) {
    local_c = mraa_adc_supported_bits();
  }
  else {
    mVar1 = mraa_has_sub_platform();
    if (mVar1 == 0) {
      local_c = 0;
    }
    else if (plat->sub_platform->aio_count == 0) {
      local_c = 0;
    }
    else {
      local_c = plat->sub_platform->adc_supported;
    }
  }
  return local_c;
}

Assistant:

unsigned int
mraa_get_platform_adc_supported_bits(int platform_offset)
{
    if (platform_offset == MRAA_MAIN_PLATFORM_OFFSET)
        return mraa_adc_supported_bits();
    else {
        if (!mraa_has_sub_platform())
            return 0;

        if (plat->sub_platform->aio_count == 0)
            return 0;

        return plat->sub_platform->adc_supported;
    }
}